

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O2

void R_Subsector(subsector_t *sub)

{
  ushort uVar1;
  FTextureID FVar2;
  sector_t *psVar3;
  secplane_t *psVar4;
  visplane_t *pvVar5;
  double dVar6;
  int iVar7;
  long lVar8;
  FMiniBSP *pFVar9;
  FSectorPortal *pFVar10;
  visplane_t *pvVar11;
  lightlist_t *plVar12;
  WORD *pWVar13;
  extsector_t *peVar14;
  uint uVar15;
  seg_t *line;
  int i;
  DWORD DVar16;
  ulong uVar17;
  uint i_2;
  subsector_t *psVar18;
  bool bVar19;
  int ceilinglightlevel;
  int floorlightlevel;
  visplane_t *local_2c0;
  visplane_t *local_2b8;
  visplane_t *local_2b0;
  visplane_t *local_2a8;
  subsector_t *local_2a0;
  sector_t local_298;
  
  psVar18 = InSubsector;
  if ((InSubsector == (subsector_t *)0x0) &&
     (lVar8 = ((long)sub - (long)subsectors) / 0x60, InSubsector = sub, numsubsectors <= lVar8)) {
    I_Error("R_Subsector: ss %ti with numss = %i",lVar8);
  }
  psVar3 = sub->sector;
  if (psVar3 != (sector_t *)0x0) {
    if (sub->polys == (FPolyNode *)0x0) {
      frontsector = psVar3;
      *(byte *)&psVar3->MoreFlags = (byte)psVar3->MoreFlags | 0x80;
      frontsector = R_FakeFlat(psVar3,&local_298,&floorlightlevel,&ceilinglightlevel,false);
      foggy = true;
      if ((level.fadeto == 0) && ((frontsector->ColorMap->Fade).field_0.d == 0)) {
        foggy = SUB41((level.flags & 8) >> 3,0);
      }
      local_2b0 = (visplane_t *)CONCAT44(local_2b0._4_4_,floorlightlevel);
      local_2b8 = (visplane_t *)CONCAT44(local_2b8._4_4_,ceilinglightlevel);
      r_actualextralight = extralight << 4;
      if (foggy != false) {
        r_actualextralight = 0;
      }
      if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
         ((frontsector->e->XFloor).lightlist.Count != 0)) {
        plVar12 = P_GetPlaneLight(frontsector,&frontsector->ceilingplane,false);
        basecolormap = plVar12->extra_colormap;
        if (plVar12->p_lightlevel != &frontsector->lightlevel) {
          ceilinglightlevel = (int)*plVar12->p_lightlevel;
        }
      }
      else {
        basecolormap = frontsector->ColorMap;
      }
      pFVar10 = sector_t::ValidatePortal(frontsector,1);
      iVar7 = secplane_t::PointOnSide(&frontsector->ceilingplane,&ViewPos);
      FVar2.texnum = frontsector->planes[1].Texture.texnum;
      if (((iVar7 < 1) && (pFVar10 == (FSectorPortal *)0x0 && FVar2.texnum != skyflatnum.texnum)) &&
         ((psVar3 = frontsector->heightsec, psVar3 == (sector_t *)0x0 ||
          (((psVar3->MoreFlags & 0x10) != 0 ||
           (psVar3->planes[0].Texture.texnum != skyflatnum.texnum)))))) {
        ceilingplane = (visplane_t *)0x0;
      }
      else {
        ceilingplane = R_FindPlane(&frontsector->ceilingplane,FVar2,
                                   r_actualextralight + ceilinglightlevel,
                                   frontsector->planes[1].alpha,
                                   SUB41((frontsector->planes[1].Flags & 4U) >> 2,0),
                                   &frontsector->planes[1].xform,frontsector->sky,pFVar10);
      }
      if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
         ((frontsector->e->XFloor).lightlist.Count != 0)) {
        plVar12 = P_GetPlaneLight(frontsector,&frontsector->floorplane,false);
        basecolormap = plVar12->extra_colormap;
        if (plVar12->p_lightlevel != &frontsector->lightlevel) {
          floorlightlevel = (int)*plVar12->p_lightlevel;
        }
      }
      else {
        basecolormap = frontsector->ColorMap;
      }
      pFVar10 = sector_t::ValidatePortal(frontsector,0);
      iVar7 = secplane_t::PointOnSide(&frontsector->floorplane,&ViewPos);
      FVar2.texnum = frontsector->planes[0].Texture.texnum;
      if (((iVar7 < 1) && (pFVar10 == (FSectorPortal *)0x0 && FVar2.texnum != skyflatnum.texnum)) &&
         ((psVar3 = frontsector->heightsec, psVar3 == (sector_t *)0x0 ||
          (((psVar3->MoreFlags & 0x10) != 0 ||
           (psVar3->planes[1].Texture.texnum != skyflatnum.texnum)))))) {
        pvVar11 = (visplane_t *)0x0;
      }
      else {
        pvVar11 = R_FindPlane(&frontsector->floorplane,FVar2,r_actualextralight + floorlightlevel,
                              frontsector->planes[0].alpha,
                              SUB41((frontsector->planes[0].Flags & 4U) >> 2,0),
                              (FTransform *)frontsector,frontsector->sky,pFVar10);
      }
      floorplane = pvVar11;
      if (((r_3dfloors.Value != 0) && (peVar14 = frontsector->e, peVar14 != (extsector_t *)0x0)) &&
         (uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count, uVar15 != 0
         )) {
        local_2a8 = ceilingplane;
        for (lVar8 = 0; lVar8 < (int)uVar15; lVar8 = lVar8 + 1) {
          fakeFloor = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[lVar8];
          uVar15 = fakeFloor->flags;
          if ((((uVar15 & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
             (psVar4 = (fakeFloor->bottom).plane,
             (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) {
            if ((uVar15 & 0x2c) != 0x20) {
              R_3D_AddHeight((fakeFloor->top).plane,frontsector);
              uVar15 = fakeFloor->flags;
            }
            if (((uVar15 & 8) != 0) && ((~uVar15 & 0x40400000) != 0 && (long)fakeFloor->alpha != 0))
            {
              fakeAlpha = (fixed_t)(((long)fakeFloor->alpha << 0x10) / 0xff);
              if (0xffff < fakeAlpha) {
                fakeAlpha = 0x10000;
              }
              if (fakeFloor->validcount != validcount) {
                fakeFloor->validcount = validcount;
                R_3D_NewClip();
              }
              pvVar5 = (visplane_t *)
                       secplane_t::ZatPoint((fakeFloor->top).plane,&frontsector->centerspot);
              if (((double)pvVar5 < ViewPos.Z) &&
                 (local_2c0 = pvVar5,
                 dVar6 = secplane_t::ZatPoint(&frontsector->floorplane,&frontsector->centerspot),
                 dVar6 < (double)local_2c0)) {
                fake3D = 1;
                local_2c0 = pvVar11;
                sector_t::operator=(&local_298,fakeFloor->model);
                psVar4 = (fakeFloor->top).plane;
                local_298.floorplane.normal.Z = (psVar4->normal).Z;
                local_298.floorplane.normal.X = (psVar4->normal).X;
                local_298.floorplane.normal.Y = (psVar4->normal).Y;
                local_298.floorplane.D = psVar4->D;
                local_298.floorplane.negiC = psVar4->negiC;
                psVar4 = (fakeFloor->bottom).plane;
                local_298.ceilingplane.normal.Z = (psVar4->normal).Z;
                local_298.ceilingplane.normal.X = (psVar4->normal).X;
                local_298.ceilingplane.normal.Y = (psVar4->normal).Y;
                local_298.ceilingplane.D = psVar4->D;
                local_298.ceilingplane.negiC = psVar4->negiC;
                bVar19 = (fakeFloor->flags & 0x40400000) == 0;
                if (bVar19) {
                  sector_t::SetTexture(&local_298,0,local_298.planes[1].Texture,true);
                }
                frontsector = &local_298;
                if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
                  plVar12 = P_GetPlaneLight(sub->sector,&local_298.floorplane,false);
                  basecolormap = plVar12->extra_colormap;
                  floorlightlevel = (int)*plVar12->p_lightlevel;
                }
                ceilingplane = (visplane_t *)0x0;
                floorplane = R_FindPlane(&frontsector->floorplane,
                                         (FTextureID)frontsector->planes[0].Texture.texnum,
                                         r_actualextralight + floorlightlevel,
                                         frontsector->planes[0].alpha,
                                         (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                         &frontsector->planes[bVar19].xform,frontsector->sky,
                                         (FSectorPortal *)0x0);
                R_FakeDrawLoop(sub);
                fake3D = 0;
                frontsector = sub->sector;
                pvVar11 = local_2c0;
              }
            }
          }
          peVar14 = frontsector->e;
          uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        }
        for (uVar17 = 0; uVar17 < uVar15; uVar17 = uVar17 + 1) {
          fakeFloor = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar17];
          uVar15 = fakeFloor->flags;
          if ((((uVar15 & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
             (psVar4 = (fakeFloor->top).plane,
             (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) {
            if ((uVar15 & 0x2c) != 0x20) {
              R_3D_AddHeight((fakeFloor->bottom).plane,frontsector);
              uVar15 = fakeFloor->flags;
            }
            if (((uVar15 & 8) != 0) &&
               ((uVar15 & 0x40400010) != 0x400010 && (long)fakeFloor->alpha != 0)) {
              fakeAlpha = (fixed_t)(((long)fakeFloor->alpha << 0x10) / 0xff);
              if (0xffff < fakeAlpha) {
                fakeAlpha = 0x10000;
              }
              if (fakeFloor->validcount != validcount) {
                fakeFloor->validcount = validcount;
                R_3D_NewClip();
              }
              pvVar5 = (visplane_t *)
                       secplane_t::ZatPoint((fakeFloor->bottom).plane,&frontsector->centerspot);
              if ((ViewPos.Z < (double)pvVar5) &&
                 (local_2c0 = pvVar5,
                 dVar6 = secplane_t::ZatPoint(&frontsector->ceilingplane,&frontsector->centerspot),
                 (double)local_2c0 < dVar6)) {
                fake3D = 2;
                local_2c0 = pvVar11;
                sector_t::operator=(&local_298,fakeFloor->model);
                psVar4 = (fakeFloor->top).plane;
                local_298.floorplane.normal.Z = (psVar4->normal).Z;
                local_298.floorplane.normal.X = (psVar4->normal).X;
                local_298.floorplane.normal.Y = (psVar4->normal).Y;
                local_298.floorplane.D = psVar4->D;
                local_298.floorplane.negiC = psVar4->negiC;
                psVar4 = (fakeFloor->bottom).plane;
                local_298.ceilingplane.normal.Z = (psVar4->normal).Z;
                local_298.ceilingplane.normal.X = (psVar4->normal).X;
                local_298.ceilingplane.normal.Y = (psVar4->normal).Y;
                local_298.ceilingplane.negiC = psVar4->negiC;
                uVar15 = fakeFloor->flags & 0x40400000;
                if ((uVar15 == 0x40400000) || (lVar8 = 1, uVar15 == 0)) {
                  local_298.planes[1].Texture.texnum = local_298.planes[0].Texture.texnum;
                  lVar8 = 0;
                }
                frontsector = &local_298;
                dVar6 = local_298.ceilingplane.normal.Z * 1.52587890625e-05;
                local_298.ceilingplane.D = psVar4->D + dVar6;
                if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
                  plVar12 = P_GetPlaneLight(sub->sector,&local_298.ceilingplane,false);
                  basecolormap = plVar12->extra_colormap;
                  ceilinglightlevel = (int)*plVar12->p_lightlevel;
                  dVar6 = local_298.ceilingplane.normal.Z * 1.52587890625e-05;
                }
                local_298.ceilingplane.D = local_298.ceilingplane.D - dVar6;
                floorplane = (visplane_t *)0x0;
                ceilingplane = R_FindPlane(&frontsector->ceilingplane,
                                           (FTextureID)frontsector->planes[1].Texture.texnum,
                                           r_actualextralight + ceilinglightlevel,
                                           frontsector->planes[1].alpha,
                                           (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                           &frontsector->planes[lVar8].xform,frontsector->sky,
                                           (FSectorPortal *)0x0);
                R_FakeDrawLoop(sub);
                fake3D = 0;
                frontsector = sub->sector;
                pvVar11 = local_2c0;
              }
            }
          }
          peVar14 = frontsector->e;
          uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        }
        fakeFloor = (F3DFloor *)0x0;
        ceilingplane = local_2a8;
        floorplane = pvVar11;
      }
      basecolormap = frontsector->ColorMap;
      floorlightlevel = (int)local_2b0;
      ceilinglightlevel = (int)local_2b8;
      iVar7 = (int)local_2b0;
      if (frontsector->planes[1].Texture.texnum == skyflatnum.texnum) {
        iVar7 = (int)local_2b8;
      }
      R_AddSprites(sub->sector,iVar7,(uint)FakeSide);
      uVar17 = ((long)sub - (long)subsectors) / 0x60;
      if ((uint)uVar17 < (uint)numsubsectors) {
        iVar7 = (ceilinglightlevel + floorlightlevel) / 2 + r_actualextralight;
        pWVar13 = ParticlesInSubsec.Array + (uVar17 & 0xffffffff);
        while (uVar1 = *pWVar13, uVar1 != 0xffff) {
          R_ProjectParticle(Particles + uVar1,sub->sector,iVar7 * -0x4000 + 0x3d0000,(uint)FakeSide)
          ;
          pWVar13 = &Particles[uVar1].snext;
        }
      }
      DVar16 = sub->numlines;
      line = sub->firstline;
      local_2a0 = psVar18;
      while (bVar19 = DVar16 != 0, DVar16 = DVar16 - 1, bVar19) {
        if (((psVar18 != (subsector_t *)0x0) || (line->sidedef == (side_t *)0x0)) ||
           ((line->sidedef->Flags & 0x40) == 0)) {
          if (((r_3dfloors.Value != 0) && (line->backsector != (sector_t *)0x0)) &&
             (frontsector->e != (extsector_t *)0x0)) {
            peVar14 = line->backsector->e;
            uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            if (uVar15 != 0) {
              local_2b0 = floorplane;
              local_2b8 = ceilingplane;
              floorplane = (visplane_t *)0x0;
              ceilingplane = (visplane_t *)0x0;
              for (uVar17 = 0; uVar17 < uVar15; uVar17 = uVar17 + 1) {
                fakeFloor = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                            [uVar17];
                if (((~fakeFloor->flags & 9) == 0) && (fakeFloor->model != (sector_t *)0x0)) {
                  fake3D = 4;
                  sector_t::operator=(&local_298,fakeFloor->model);
                  psVar4 = (fakeFloor->top).plane;
                  local_298.floorplane.normal.Z = (psVar4->normal).Z;
                  local_298.floorplane.normal.X = (psVar4->normal).X;
                  local_298.floorplane.normal.Y = (psVar4->normal).Y;
                  local_298.floorplane.D = psVar4->D;
                  local_298.floorplane.negiC = psVar4->negiC;
                  psVar4 = (fakeFloor->bottom).plane;
                  local_298.ceilingplane.normal.Z = (psVar4->normal).Z;
                  local_298.ceilingplane.normal.X = (psVar4->normal).X;
                  local_298.ceilingplane.normal.Y = (psVar4->normal).Y;
                  local_298.ceilingplane.D = psVar4->D;
                  local_298.ceilingplane.negiC = psVar4->negiC;
                  backsector = &local_298;
                  if (fakeFloor->validcount != validcount) {
                    fakeFloor->validcount = validcount;
                    R_3D_NewClip();
                  }
                  R_AddLine(line);
                  peVar14 = line->backsector->e;
                  uVar15 = (peVar14->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                }
              }
              fakeFloor = (F3DFloor *)0x0;
              fake3D = 0;
              floorplane = local_2b0;
              ceilingplane = local_2b8;
              psVar18 = local_2a0;
            }
          }
          R_AddLine(line);
        }
        line = line + 1;
      }
    }
    else {
      pFVar9 = sub->BSP;
      if ((pFVar9 == (FMiniBSP *)0x0) || (pFVar9->bDirty == true)) {
        subsector_t::BuildPolyBSP(sub);
        pFVar9 = sub->BSP;
      }
      uVar15 = (pFVar9->Nodes).Count;
      if (uVar15 == 0) {
        R_Subsector((pFVar9->Subsectors).Array);
      }
      else {
        R_RenderBSPNode((pFVar9->Nodes).Array + (uVar15 - 1));
      }
    }
    if (psVar18 == (subsector_t *)0x0) {
      InSubsector = (subsector_t *)0x0;
    }
    return;
  }
  __assert_fail("sub->sector != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_bsp.cpp"
                ,0x42d,"void R_Subsector(subsector_t *)");
}

Assistant:

void R_Subsector (subsector_t *sub)
{
	int 		 count;
	seg_t*		 line;
	sector_t     tempsec;				// killough 3/7/98: deep water hack
	int          floorlightlevel;		// killough 3/16/98: set floor lightlevel
	int          ceilinglightlevel;		// killough 4/11/98
	bool		 outersubsector;
	int	fll, cll, position;
	FSectorPortal *portal;

	// kg3D - fake floor stuff
	visplane_t *backupfp;
	visplane_t *backupcp;
	//secplane_t templane;
	lightlist_t *light;

	if (InSubsector != NULL)
	{ // InSubsector is not NULL. This means we are rendering from a mini-BSP.
		outersubsector = false;
	}
	else
	{
		outersubsector = true;
		InSubsector = sub;
	}

#ifdef RANGECHECK
	if (outersubsector && sub - subsectors >= (ptrdiff_t)numsubsectors)
		I_Error ("R_Subsector: ss %ti with numss = %i", sub - subsectors, numsubsectors);
#endif

	assert(sub->sector != NULL);

	if (sub->polys)
	{ // Render the polyobjs in the subsector first
		R_AddPolyobjs(sub);
		if (outersubsector)
		{
			InSubsector = NULL;
		}
		return;
	}

	frontsector = sub->sector;
	frontsector->MoreFlags |= SECF_DRAWN;
	count = sub->numlines;
	line = sub->firstline;

	// killough 3/8/98, 4/4/98: Deep water / fake ceiling effect
	frontsector = R_FakeFlat(frontsector, &tempsec, &floorlightlevel,
						   &ceilinglightlevel, false);	// killough 4/11/98

	fll = floorlightlevel;
	cll = ceilinglightlevel;

	// [RH] set foggy flag
	foggy = level.fadeto || frontsector->ColorMap->Fade || (level.flags & LEVEL_HASFADETABLE);
	r_actualextralight = foggy ? 0 : extralight << 4;

	// kg3D - fake lights
	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->ceilingplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real ceiling, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			ceilinglightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = frontsector->ColorMap;
	}

	portal = frontsector->ValidatePortal(sector_t::ceiling);

	ceilingplane = frontsector->ceilingplane.PointOnSide(ViewPos) > 0 ||
		frontsector->GetTexture(sector_t::ceiling) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec && 
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::floor) == skyflatnum) ?
		R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(frontsector->GetFlags(sector_t::ceiling) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::ceiling].xform,
					frontsector->sky,
					portal
					) : NULL;

	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->floorplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real floor, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			floorlightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = frontsector->ColorMap;
	}

	// killough 3/7/98: Add (x,y) offsets to flats, add deep water check
	// killough 3/16/98: add floorlightlevel
	// killough 10/98: add support for skies transferred from sidedefs
	portal = frontsector->ValidatePortal(sector_t::floor);

	floorplane = frontsector->floorplane.PointOnSide(ViewPos) > 0 || // killough 3/7/98
		frontsector->GetTexture(sector_t::floor) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec &&
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::ceiling) == skyflatnum) ?
		R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(frontsector->GetFlags(sector_t::floor) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::floor].xform,
					frontsector->sky,
					portal
					) : NULL;

	// kg3D - fake planes rendering
	if (r_3dfloors && frontsector->e && frontsector->e->XFloor.ffloors.Size())
	{
		backupfp = floorplane;
		backupcp = ceilingplane;
		// first check all floors
		for (int i = 0; i < (int)frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->bottom.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->top.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);
			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->top.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight < ViewPos.Z &&
				fakeHeight > frontsector->floorplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKEFLOOR;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if (!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::floor, tempsec.GetTexture(sector_t::ceiling));
					position = sector_t::ceiling;
				} else position = sector_t::floor;
				frontsector = &tempsec;

				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->floorplane, false);
					basecolormap = light->extra_colormap;
					floorlightlevel = *light->p_lightlevel;
				}

				ceilingplane = NULL;
				floorplane = R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		// and now ceilings
		for (unsigned int i = 0; i < frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->top.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->bottom.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (!(fakeFloor->flags & FF_THISINSIDE) && (fakeFloor->flags & (FF_SWIMMABLE|FF_INVERTSECTOR)) == (FF_SWIMMABLE|FF_INVERTSECTOR)) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);

			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->bottom.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight > ViewPos.Z &&
				fakeHeight < frontsector->ceilingplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKECEILING;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if ((!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR)) ||
					(fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::ceiling, tempsec.GetTexture(sector_t::floor));
					position = sector_t::floor;
				} else position = sector_t::ceiling;
				frontsector = &tempsec;

				tempsec.ceilingplane.ChangeHeight(-1 / 65536.);
				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->ceilingplane, false);
					basecolormap = light->extra_colormap;
					ceilinglightlevel = *light->p_lightlevel;
				}
				tempsec.ceilingplane.ChangeHeight(1 / 65536.);

				floorplane = NULL;
				ceilingplane = R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		fakeFloor = NULL;
		floorplane = backupfp;
		ceilingplane = backupcp;
	}

	basecolormap = frontsector->ColorMap;
	floorlightlevel = fll;
	ceilinglightlevel = cll;

	// killough 9/18/98: Fix underwater slowdown, by passing real sector 
	// instead of fake one. Improve sprite lighting by basing sprite
	// lightlevels on floor & ceiling lightlevels in the surrounding area.
	// [RH] Handle sprite lighting like Duke 3D: If the ceiling is a sky, sprites are lit by
	// it, otherwise they are lit by the floor.
	R_AddSprites (sub->sector, frontsector->GetTexture(sector_t::ceiling) == skyflatnum ?
		ceilinglightlevel : floorlightlevel, FakeSide);

	// [RH] Add particles
	if ((unsigned int)(sub - subsectors) < (unsigned int)numsubsectors)
	{ // Only do it for the main BSP.
		int shade = LIGHT2SHADE((floorlightlevel + ceilinglightlevel)/2 + r_actualextralight);
		for (WORD i = ParticlesInSubsec[(unsigned int)(sub-subsectors)]; i != NO_PARTICLE; i = Particles[i].snext)
		{
			R_ProjectParticle (Particles + i, subsectors[sub-subsectors].sector, shade, FakeSide);
		}
	}

	count = sub->numlines;
	line = sub->firstline;

	while (count--)
	{
		if (!outersubsector || line->sidedef == NULL || !(line->sidedef->Flags & WALLF_POLYOBJ))
		{
			// kg3D - fake planes bounding calculation
			if (r_3dfloors && line->backsector && frontsector->e && line->backsector->e->XFloor.ffloors.Size())
			{
				backupfp = floorplane;
				backupcp = ceilingplane;
				floorplane = NULL;
				ceilingplane = NULL;
				for (unsigned int i = 0; i < line->backsector->e->XFloor.ffloors.Size(); i++)
				{
					fakeFloor = line->backsector->e->XFloor.ffloors[i];
					if (!(fakeFloor->flags & FF_EXISTS)) continue;
					if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
					if (!fakeFloor->model) continue;
					fake3D = FAKE3D_FAKEBACK;
					tempsec = *fakeFloor->model;
					tempsec.floorplane = *fakeFloor->top.plane;
					tempsec.ceilingplane = *fakeFloor->bottom.plane;
					backsector = &tempsec;
					if (fakeFloor->validcount != validcount)
					{
						fakeFloor->validcount = validcount;
						R_3D_NewClip();
					}
					R_AddLine(line); // fake
				}
				fakeFloor = NULL;
				fake3D = 0;
				floorplane = backupfp;
				ceilingplane = backupcp;
			}
			R_AddLine (line); // now real
		}
		line++;
	}
	if (outersubsector)
	{
		InSubsector = NULL;
	}
}